

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int luaB_assert(lua_State *L)

{
  int iVar1;
  
  iVar1 = lua_toboolean(L,1);
  if (iVar1 != 0) {
    iVar1 = lua_gettop(L);
    return iVar1;
  }
  luaL_checkany(L,1);
  lua_rotate(L,1,-1);
  lua_settop(L,-2);
  lua_pushstring(L,"assertion failed!");
  lua_settop(L,1);
  iVar1 = luaB_error(L);
  return iVar1;
}

Assistant:

static int luaB_assert (lua_State *L) {
  if (l_likely(lua_toboolean(L, 1)))  /* condition is true? */
    return lua_gettop(L);  /* return all arguments */
  else {  /* error */
    luaL_checkany(L, 1);  /* there must be a condition */
    lua_remove(L, 1);  /* remove it */
    lua_pushliteral(L, "assertion failed!");  /* default message */
    lua_settop(L, 1);  /* leave only message (default if no other one) */
    return luaB_error(L);  /* call 'error' */
  }
}